

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bson-error.c
# Opt level: O0

char * bson_strerror_r(int err_code,char *buf,size_t buflen)

{
  int iVar1;
  undefined8 local_28;
  char *ret;
  size_t buflen_local;
  char *buf_local;
  int err_code_local;
  
  local_28 = (char *)0x0;
  iVar1 = __xpg_strerror_r(err_code,buf,buflen);
  if (iVar1 == 0) {
    local_28 = buf;
  }
  if (local_28 == (char *)0x0) {
    bson_strncpy(buf,bson_strerror_r::unknown_msg,buflen);
    local_28 = buf;
  }
  return local_28;
}

Assistant:

char *
bson_strerror_r (int err_code,  /* IN */
                 char *buf,     /* IN */
                 size_t buflen) /* IN */
{
   static const char *unknown_msg = "Unknown error";
   char *ret = NULL;

#if defined(_WIN32)
   if (strerror_s (buf, buflen, err_code) != 0) {
      ret = buf;
   }
#elif defined(__GNUC__) && defined(_GNU_SOURCE)
   ret = strerror_r (err_code, buf, buflen);
#else /* XSI strerror_r */
   if (strerror_r (err_code, buf, buflen) == 0) {
      ret = buf;
   }
#endif

   if (!ret) {
      bson_strncpy (buf, unknown_msg, buflen);
      ret = buf;
   }

   return ret;
}